

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O1

void nhdp_domain_init_neighbor(nhdp_neighbor *neigh)

{
  int iVar1;
  list_entity **pplVar2;
  long lVar3;
  list_entity *plVar4;
  
  lVar3 = 0;
  do {
    *(undefined8 *)((long)&neigh->_domaindata[0].metric.in + lVar3) = 0xffffff00ffffff;
    *(undefined8 *)((long)&neigh->_domaindata[0].best_out_link + lVar3) = 0;
    *(undefined4 *)((long)&neigh->_domaindata[0].best_out_link_metric + lVar3) = 0xffffff;
    (&neigh->_domaindata[0].willingness)[lVar3] = '\0';
    *(undefined2 *)(&neigh->_domaindata[0].local_is_mpr + lVar3) = 0;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x80);
  plVar4 = _domain_list.next;
  if ((_domain_list.next)->prev != _domain_list.prev) {
    do {
      if (*(char *)&plVar4[-0x28].next[2].next == '\x01') {
        iVar1 = *(int *)((long)&plVar4[-0x27].next + 4);
        neigh->_domaindata[iVar1].metric.in = *(uint32_t *)&plVar4[-0x28].next[1].next;
        neigh->_domaindata[iVar1].metric.out = *(uint32_t *)((long)&plVar4[-0x28].next[1].next + 4);
      }
      pplVar2 = &plVar4->next;
      plVar4 = *pplVar2;
    } while ((*pplVar2)->prev != _domain_list.prev);
  }
  return;
}

Assistant:

void
nhdp_domain_init_neighbor(struct nhdp_neighbor *neigh) {
  struct nhdp_domain *domain;
  struct nhdp_neighbor_domaindata *data;
  int i;

  for (i = 0; i < NHDP_MAXIMUM_DOMAINS; i++) {
    neigh->_domaindata[i].metric.in = RFC7181_METRIC_INFINITE;
    neigh->_domaindata[i].metric.out = RFC7181_METRIC_INFINITE;

    neigh->_domaindata[i].best_out_link = NULL;
    neigh->_domaindata[i].best_out_link_metric = RFC7181_METRIC_INFINITE;
    neigh->_domaindata[i].willingness = RFC7181_WILLINGNESS_NEVER;

    neigh->_domaindata[i].local_is_mpr = false;
    neigh->_domaindata[i].neigh_is_mpr = false;
  }

  /* initialize metrics and mprs */
  list_for_each_element(&_domain_list, domain, _node) {
    data = nhdp_domain_get_neighbordata(domain, neigh);

    if (domain->metric->no_default_handling) {
      data->metric.in = domain->metric->incoming_link_start;
      data->metric.out = domain->metric->outgoing_link_start;
    }
  }
}